

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

char * ImAtoi<long_long>(char *src,longlong *output)

{
  bool bVar1;
  long local_38;
  long local_28;
  longlong v;
  int negative;
  longlong *output_local;
  char *src_local;
  
  output_local = (longlong *)src;
  if (*src == '-') {
    output_local = (longlong *)(src + 1);
  }
  if ((char)*output_local == '+') {
    output_local = (longlong *)((long)output_local + 1);
  }
  local_28 = 0;
  while( true ) {
    bVar1 = false;
    if ('/' < (char)*output_local) {
      bVar1 = (char)*output_local < ':';
    }
    if (!bVar1) break;
    local_28 = local_28 * 10 + (long)((char)*output_local + -0x30);
    output_local = (longlong *)((long)output_local + 1);
  }
  if (*src == '-') {
    local_38 = -local_28;
  }
  else {
    local_38 = local_28;
  }
  *output = local_38;
  return (char *)output_local;
}

Assistant:

static const char* ImAtoi(const char* src, TYPE* output)
{
    int negative = 0;
    if (*src == '-') { negative = 1; src++; }
    if (*src == '+') { src++; }
    TYPE v = 0;
    while (*src >= '0' && *src <= '9')
        v = (v * 10) + (*src++ - '0');
    *output = negative ? -v : v;
    return src;
}